

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

bool __thiscall IMLE::save(IMLE *this,string *filename)

{
  char cVar1;
  text_oarchive archive;
  ofstream fs;
  
  std::ofstream::ofstream(&fs,(filename->_M_dataplus)._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&archive,
                   "IMLE: Could not open file ",filename);
    message(this,(string *)&archive);
    std::__cxx11::string::_M_dispose();
  }
  else {
    boost::archive::text_oarchive::text_oarchive(&archive,(ostream *)&fs,0);
    boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
    invoke<IMLE>(&archive,this);
    std::ofstream::close();
    boost::archive::text_oarchive_impl<boost::archive::text_oarchive>::~text_oarchive_impl
              (&archive.super_text_oarchive_impl<boost::archive::text_oarchive>);
  }
  std::ofstream::~ofstream(&fs);
  return (bool)cVar1;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::save(std::string const &filename)
{
    std::ofstream fs(filename.c_str());

	if( !fs.is_open() )
	{
		message(OPENERR + filename);
		return false;
	}
    boost::archive::text_oarchive archive(fs);

	archive & (*this);
    fs.close();

    return true;
}